

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  Int IVar2;
  time_t tVar3;
  char *pcVar4;
  Value *pVVar5;
  Value *key;
  StyledWriter *this;
  size_t __n;
  long in_RSI;
  int in_EDI;
  Value *o;
  Value *d2;
  Value *d;
  Value *o_1;
  int i;
  Value output;
  StyledWriter writer;
  ofstream fout;
  int wa;
  bool wa1;
  bool wa0;
  Value o1;
  Value o0;
  string so1;
  string so0;
  string si1;
  string si0;
  int first;
  int winner;
  Value *in_stack_fffffffffffff3a8;
  StyledWriter *in_stack_fffffffffffff3b0;
  undefined4 in_stack_fffffffffffff3b8;
  ValueType in_stack_fffffffffffff3bc;
  uint value;
  GameBoard *in_stack_fffffffffffff3c0;
  undefined8 in_stack_fffffffffffff3c8;
  int index;
  Value *in_stack_fffffffffffff3d0;
  GameBoard *in_stack_fffffffffffff3d8;
  Value *in_stack_fffffffffffff3e0;
  GameBoard *in_stack_fffffffffffff3e8;
  undefined8 in_stack_fffffffffffff3f8;
  Value *in_stack_fffffffffffff408;
  Value *in_stack_fffffffffffff410;
  undefined8 in_stack_fffffffffffff460;
  undefined8 in_stack_fffffffffffff468;
  undefined8 in_stack_fffffffffffff470;
  GameBoard *in_stack_fffffffffffff478;
  bool local_af7;
  bool local_af5;
  string local_960 [56];
  undefined8 in_stack_fffffffffffff6d8;
  int in_stack_fffffffffffff6e4;
  string *in_stack_fffffffffffff758;
  int local_7b4;
  undefined1 local_7b0 [40];
  undefined1 local_788 [112];
  ostream local_718 [516];
  int local_514;
  int local_510;
  bool local_50a;
  bool local_509;
  string local_4b8 [72];
  string local_470 [159];
  allocator local_3d1;
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [39];
  allocator local_329;
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  Value local_c8;
  Value local_a0;
  Value local_78;
  Value local_40;
  int local_18;
  uint local_14;
  long local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI == 4) {
    local_14 = 0xfffffffe;
    local_10 = in_RSI;
    do {
      printf("Round %d\n",(ulong)(uint)turnID);
      if (turnID == 1) {
        tVar3 = time((time_t *)0x0);
        srand((uint)tVar3);
        local_18 = rand();
        local_18 = local_18 % 7;
        Json::Value::Value(&local_40,local_18);
        Json::Value::operator[]
                  (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
        Json::Value::operator[]
                  (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
        Json::Value::operator[]
                  ((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
        Json::Value::operator=((Value *)in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
        Json::Value::~Value(in_stack_fffffffffffff3e0);
        Json::Value::Value(&local_78,0);
        Json::Value::operator[]
                  (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
        Json::Value::operator[]
                  (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
        Json::Value::operator[]
                  ((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
        Json::Value::operator=((Value *)in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
        Json::Value::~Value(in_stack_fffffffffffff3e0);
        Json::Value::Value(&local_a0,local_18);
        Json::Value::operator[]
                  (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
        Json::Value::operator[]
                  (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
        Json::Value::operator[]
                  ((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
        Json::Value::operator=((Value *)in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
        Json::Value::~Value(in_stack_fffffffffffff3e0);
        Json::Value::Value(&local_c8,1);
        Json::Value::operator[]
                  (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
        Json::Value::operator[]
                  (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
        Json::Value::operator[]
                  ((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
        Json::Value::operator=((Value *)in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
        Json::Value::~Value(in_stack_fffffffffffff3e0);
      }
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff3f8 >> 0x20));
      std::operator+((char *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff3b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                     (char *)in_stack_fffffffffffff3b0);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff3f8 >> 0x20));
      std::operator+((char *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff3b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                     (char *)in_stack_fffffffffffff3b0);
      std::__cxx11::string::~string(local_168);
      std::__cxx11::string::~string(local_188);
      std::__cxx11::string::string(local_1a8,local_e8);
      makeInput(in_stack_fffffffffffff6e4,(string *)in_stack_fffffffffffff6d8);
      std::__cxx11::string::~string(local_1a8);
      std::__cxx11::string::string(local_1c8,local_148);
      makeInput(in_stack_fffffffffffff6e4,(string *)in_stack_fffffffffffff6d8);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff3f8 >> 0x20));
      std::operator+((char *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff3b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                     (char *)in_stack_fffffffffffff3b0);
      std::__cxx11::string::~string(local_208);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff3f8 >> 0x20));
      std::operator+((char *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff3b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                     (char *)in_stack_fffffffffffff3b0);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_288);
      pcVar4 = *(char **)(local_10 + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_328,pcVar4,&local_329);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                     (char *)in_stack_fffffffffffff3b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff3b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                     (char *)in_stack_fffffffffffff3b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff3b0);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      system(pcVar4);
      std::__cxx11::string::~string(local_2a8);
      std::__cxx11::string::~string(local_2c8);
      std::__cxx11::string::~string(local_2e8);
      std::__cxx11::string::~string(local_308);
      std::__cxx11::string::~string(local_328);
      std::allocator<char>::~allocator((allocator<char> *)&local_329);
      pcVar4 = *(char **)(local_10 + 0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3d0,pcVar4,&local_3d1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                     (char *)in_stack_fffffffffffff3b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff3b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                     (char *)in_stack_fffffffffffff3b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff3b0);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      system(pcVar4);
      std::__cxx11::string::~string(local_350);
      std::__cxx11::string::~string(local_370);
      std::__cxx11::string::~string(local_390);
      std::__cxx11::string::~string(local_3b0);
      std::__cxx11::string::~string(local_3d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
      Json::Value::Value((Value *)in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bc);
      Json::Value::Value((Value *)in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bc);
      std::__cxx11::string::string(local_470,local_1e8);
      getOutput(in_stack_fffffffffffff758);
      Json::Value::operator=((Value *)in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
      Json::Value::~Value(in_stack_fffffffffffff3e0);
      std::__cxx11::string::~string(local_470);
      std::__cxx11::string::string(local_4b8,local_248);
      getOutput(in_stack_fffffffffffff758);
      Json::Value::operator=((Value *)in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
      Json::Value::~Value(in_stack_fffffffffffff3e0);
      std::__cxx11::string::~string(local_4b8);
      Json::Value::Value(in_stack_fffffffffffff410,in_stack_fffffffffffff408);
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator=((Value *)in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
      Json::Value::~Value(in_stack_fffffffffffff3e0);
      Json::Value::Value(in_stack_fffffffffffff410,in_stack_fffffffffffff408);
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator=((Value *)in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
      Json::Value::~Value(in_stack_fffffffffffff3e0);
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::asInt((Value *)in_stack_fffffffffffff3e8);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::asInt((Value *)in_stack_fffffffffffff3e8);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::asInt((Value *)in_stack_fffffffffffff3e8);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::asInt((Value *)in_stack_fffffffffffff3e8);
      bVar1 = GameBoard::place(in_stack_fffffffffffff478,
                               (int)((ulong)in_stack_fffffffffffff470 >> 0x20),
                               (int)in_stack_fffffffffffff470,
                               (int)((ulong)in_stack_fffffffffffff468 >> 0x20),
                               (int)in_stack_fffffffffffff468,
                               (int)((ulong)in_stack_fffffffffffff460 >> 0x20));
      local_509 = (bool)(~bVar1 & 1);
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      IVar2 = Json::Value::asInt((Value *)in_stack_fffffffffffff3e8);
      gameBoard.typeCountForColor[0][IVar2] = gameBoard.typeCountForColor[0][IVar2] + 1;
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::asInt((Value *)in_stack_fffffffffffff3e8);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::asInt((Value *)in_stack_fffffffffffff3e8);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::asInt((Value *)in_stack_fffffffffffff3e8);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::asInt((Value *)in_stack_fffffffffffff3e8);
      bVar1 = GameBoard::place(in_stack_fffffffffffff478,
                               (int)((ulong)in_stack_fffffffffffff470 >> 0x20),
                               (int)in_stack_fffffffffffff470,
                               (int)((ulong)in_stack_fffffffffffff468 >> 0x20),
                               (int)in_stack_fffffffffffff468,
                               (int)((ulong)in_stack_fffffffffffff460 >> 0x20));
      local_50a = (bool)(~bVar1 & 1);
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      IVar2 = Json::Value::asInt((Value *)in_stack_fffffffffffff3e8);
      __n = (size_t)IVar2;
      gameBoard.typeCountForColor[1][__n] = gameBoard.typeCountForColor[1][__n] + 1;
      local_af5 = true;
      if ((local_509 & 1U) == 0) {
        local_af5 = GameBoard::typeCountError(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bc);
      }
      local_509 = local_af5;
      local_af7 = true;
      if ((local_50a & 1U) == 0) {
        local_af7 = GameBoard::typeCountError(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bc);
      }
      local_50a = local_af7;
      if ((local_509 & 1U) != 0) {
        puts("player 0 error");
        local_14 = 1;
      }
      if ((local_50a & 1U) != 0) {
        puts("player 1 error");
        if (local_14 == 1) {
          local_14 = 0xfffffffe;
        }
        else {
          local_14 = 0;
        }
      }
      if (((local_509 & 1U) == 0) && ((local_50a & 1U) == 0)) {
        GameBoard::eliminate(&gameBoard,0);
        GameBoard::eliminate(&gameBoard,1);
        local_514 = GameBoard::transfer(in_stack_fffffffffffff3d8);
        if (local_514 == -1) {
          Json::Value::operator[]
                    ((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
          Json::Value::asInt((Value *)in_stack_fffffffffffff3e8);
          bVar1 = GameBoard::canPut(in_stack_fffffffffffff3e8,
                                    (int)((ulong)in_stack_fffffffffffff3e0 >> 0x20),
                                    (int)in_stack_fffffffffffff3e0);
          local_509 = (bool)(~bVar1 & 1);
          Json::Value::operator[]
                    ((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
          Json::Value::asInt((Value *)in_stack_fffffffffffff3e8);
          bVar1 = GameBoard::canPut(in_stack_fffffffffffff3e8,
                                    (int)((ulong)in_stack_fffffffffffff3e0 >> 0x20),
                                    (int)in_stack_fffffffffffff3e0);
          local_50a = (bool)((bVar1 ^ 0xffU) & 1);
          if (((local_509 & 1U) == 0) || (local_50a == false)) {
            if ((local_509 & 1U) == 0) {
              if (local_50a != false) {
                local_14 = 0;
              }
            }
            else {
              local_14 = 1;
            }
          }
          else if (gameBoard.elimTotal[0] == gameBoard.elimTotal[1]) {
            local_14 = 0xfffffffe;
          }
          else {
            __n = 1;
            local_14 = (uint)(gameBoard.elimTotal[0] - gameBoard.elimTotal[1] < 0);
          }
          if (((local_509 & 1U) == 0) && (local_50a == false)) {
            if (turnID == 300) {
              local_14 = 0xfffffffe;
              local_510 = 3;
            }
            else {
              turnID = turnID + 1;
              local_510 = 0;
            }
          }
          else {
            local_510 = 3;
          }
        }
        else {
          local_14 = 1 - local_514;
          local_510 = 3;
        }
      }
      else {
        local_510 = 3;
      }
      Json::Value::~Value(in_stack_fffffffffffff3e0);
      Json::Value::~Value(in_stack_fffffffffffff3e0);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string(local_e8);
    } while (local_510 == 0);
    std::ofstream::ofstream(local_718,*(undefined8 *)(local_10 + 0x18),0x10);
    Json::StyledWriter::StyledWriter(in_stack_fffffffffffff3b0);
    Json::Value::Value((Value *)in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bc);
    for (local_7b4 = 1; index = (int)((ulong)in_stack_fffffffffffff3c8 >> 0x20), local_7b4 <= turnID
        ; local_7b4 = local_7b4 + 1) {
      Json::Value::operator[](in_stack_fffffffffffff3d0,index);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::Value((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::operator=((Value *)in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
      Json::Value::~Value(in_stack_fffffffffffff3e0);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::Value(in_stack_fffffffffffff410,in_stack_fffffffffffff408);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::operator=((Value *)in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
      Json::Value::~Value(in_stack_fffffffffffff3e0);
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::Value(in_stack_fffffffffffff410,in_stack_fffffffffffff408);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::operator=((Value *)in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
      Json::Value::~Value(in_stack_fffffffffffff3e0);
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::Value(in_stack_fffffffffffff410,in_stack_fffffffffffff408);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator=((Value *)in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
      Json::Value::~Value(in_stack_fffffffffffff3e0);
      pVVar5 = Json::Value::operator[]
                         ((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      key = Json::Value::operator[]
                      ((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::removeMember(pVVar5,(char *)key);
      Json::Value::~Value(in_stack_fffffffffffff3e0);
      in_stack_fffffffffffff410 =
           Json::Value::operator[]
                     (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      in_stack_fffffffffffff408 =
           Json::Value::operator[]
                     (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::Value(in_stack_fffffffffffff410,in_stack_fffffffffffff408);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::operator=((Value *)in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
      Json::Value::~Value(in_stack_fffffffffffff3e0);
      Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      in_stack_fffffffffffff3e0 =
           Json::Value::operator[]
                     ((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
      Json::Value::operator[]
                (in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      Json::Value::removeMember(pVVar5,(char *)key);
      Json::Value::~Value(in_stack_fffffffffffff3e0);
    }
    Json::Value::operator[](in_stack_fffffffffffff3d0,index);
    Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
    Json::Value::Value((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
    Json::Value::operator[]((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
    Json::Value::operator=((Value *)in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
    Json::Value::~Value(in_stack_fffffffffffff3e0);
    value = local_14;
    if (-1 < (int)local_14) {
      value = 1 - local_14;
    }
    Json::Value::Value((Value *)(local_960 + 0x20),value);
    this = (StyledWriter *)
           Json::Value::operator[]
                     ((Value *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
    pVVar5 = Json::Value::operator[]((Value *)this,(char *)in_stack_fffffffffffff3a8);
    Json::Value::operator=((Value *)this,pVVar5);
    Json::Value::~Value(in_stack_fffffffffffff3e0);
    Json::StyledWriter::write_abi_cxx11_((StyledWriter *)local_960,(int)local_788,local_7b0,__n);
    std::operator<<(local_718,local_960);
    std::__cxx11::string::~string(local_960);
    std::ofstream::close();
    printf("winner:%d\n",(ulong)local_14);
    local_4 = 0;
    local_510 = 1;
    Json::Value::~Value(in_stack_fffffffffffff3e0);
    Json::StyledWriter::~StyledWriter(this);
    std::ofstream::~ofstream(local_718);
  }
  else {
    puts("usage: logic player1 player2 output");
    puts("this program will create lots of temporary files !!!");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc != 4) {
        puts("usage: logic player1 player2 output");
        puts("this program will create lots of temporary files !!!");
        return 1;
    }

    int winner = -2;

    while (1) {
        printf("Round %d\n", turnID);
        if (turnID == 1) {
            srand(time(NULL));
            int first = rand() % 7;
            logger[0][0]["block"] = first;
            logger[0][0]["color"] = 0;
            logger[0][1]["block"] = first;
            logger[0][1]["color"] = 1;
        }
        string si0 = "in_" + to_string(turnID) + "_0.txt";
        string si1 = "in_" + to_string(turnID) + "_1.txt";
        makeInput(0, si0);
        makeInput(1, si1);
        string so0 = "out_" + to_string(turnID) + "_0.txt";
        string so1 = "out_" + to_string(turnID) + "_1.txt";
        system((string(argv[1]) + " < " + si0 + " > " + so0).c_str());
        system((string(argv[2]) + " < " + si1 + " > " + so1).c_str());
        Json::Value o0, o1;
        o0 = getOutput(so0);
        o1 = getOutput(so1);
        logger[turnID][0] = o1;
        logger[turnID][1] = o0;
        bool wa0, wa1;
        wa0 = !gameBoard.place(0, logger[turnID - 1][0]["block"].asInt(), o0["y"].asInt(), o0["x"].asInt(), o0["o"].asInt());
        ++gameBoard.typeCountForColor[0][logger[turnID - 1][0]["block"].asInt()];
        wa1 = !gameBoard.place(1, logger[turnID - 1][1]["block"].asInt(), o1["y"].asInt(), o1["x"].asInt(), o1["o"].asInt());
        ++gameBoard.typeCountForColor[1][logger[turnID - 1][1]["block"].asInt()];
        wa0 = wa0 || gameBoard.typeCountError(1);
        wa1 = wa1 || gameBoard.typeCountError(0);
        if (wa0) {
            puts("player 0 error");
            winner = 1;
        }
        if (wa1) {
            puts("player 1 error");
            if (winner != 1)
                winner = 0;
            else
                winner = -2;
        }
        if (wa0 || wa1)
            break;
        gameBoard.eliminate(0);
        gameBoard.eliminate(1);
        int wa = gameBoard.transfer();
        if (wa != -1) {
            winner = 1 - wa;
            break;
        }
        wa0 = !gameBoard.canPut(0, o1["block"].asInt());
        wa1 = !gameBoard.canPut(1, o0["block"].asInt());
        if (wa0 && wa1) {
            winner = gameBoard.elimTotal[0] - gameBoard.elimTotal[1];
            if (winner == 0)
                winner = -2;
            else
                winner = (winner < 0 ? 1 : 0);
        }
        else if (wa0)
            winner = 1;
        else if (wa1)
            winner = 0;
        if (wa0 || wa1)
            break;
        if (turnID == 300) {
            winner = -2;
            break;
        }
        ++turnID;
    }

    ofstream fout(argv[3]);
    Json::StyledWriter writer;
    Json::Value output;
    for (int i = 1; i <= turnID; ++i) {
        auto &o = output[i - 1]["output"];
        o["command"] = "request";
        auto &d = o["display"];
        d["0"]["block"] = logger[i - 1][1]["block"];
        d["1"]["block"] = logger[i - 1][0]["block"];
        auto &d2 = output[i]["output"]["display"];
        d2["0"]["route"][0] = logger[i][1];
        d2["0"]["route"][0].removeMember("block");
        d2["1"]["route"][0] = logger[i][0];
        d2["1"]["route"][0].removeMember("block");
    }
    auto &o = output[turnID]["output"];
    o["command"] = "finish";
    o["display"]["result"] = (winner >= 0 ? 1 - winner : winner);
    fout << writer.write(output);
    fout.close();
    printf("winner:%d\n",winner);
    return 0;
}